

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::StringFieldGenerator::GenerateClearingCode
          (StringFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  ulong uVar2;
  Printer *printer_local;
  StringFieldGenerator *this_local;
  
  bVar1 = SupportsArenas(this->descriptor_);
  if (bVar1) {
    FieldDescriptor::default_value_string_abi_cxx11_(this->descriptor_);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      io::Printer::Print(printer,&this->variables_,
                         "$name$_.ClearToDefault($default_variable$, GetArenaNoVirtual());\n");
    }
    else {
      io::Printer::Print(printer,&this->variables_,
                         "$name$_.ClearToEmpty($default_variable$, GetArenaNoVirtual());\n");
    }
  }
  else {
    FieldDescriptor::default_value_string_abi_cxx11_(this->descriptor_);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      io::Printer::Print(printer,&this->variables_,
                         "$name$_.ClearToDefaultNoArena($default_variable$);\n");
    }
    else {
      io::Printer::Print(printer,&this->variables_,
                         "$name$_.ClearToEmptyNoArena($default_variable$);\n");
    }
  }
  return;
}

Assistant:

void StringFieldGenerator::
GenerateClearingCode(io::Printer* printer) const {
  // Two-dimension specialization here: supporting arenas or not, and default
  // value is the empty string or not. Complexity here ensures the minimal
  // number of branches / amount of extraneous code at runtime (given that the
  // below methods are inlined one-liners)!
  if (SupportsArenas(descriptor_)) {
    if (descriptor_->default_value_string().empty()) {
      printer->Print(variables_,
        "$name$_.ClearToEmpty($default_variable$, GetArenaNoVirtual());\n");
    } else {
      printer->Print(variables_,
        "$name$_.ClearToDefault($default_variable$, GetArenaNoVirtual());\n");
    }
  } else {
    if (descriptor_->default_value_string().empty()) {
      printer->Print(variables_,
        "$name$_.ClearToEmptyNoArena($default_variable$);\n");
    } else {
      printer->Print(variables_,
        "$name$_.ClearToDefaultNoArena($default_variable$);\n");
    }
  }
}